

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

uint aom_highbd_avg_8x8_c(uint8_t *s8,int p)

{
  uint16_t *s;
  int sum;
  int j;
  int i;
  int p_local;
  uint8_t *s8_local;
  
  sum = 0;
  s = (uint16_t *)((long)s8 << 1);
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      sum = (uint)s[j] + sum;
    }
    s = s + p;
  }
  return sum + 0x20 >> 6;
}

Assistant:

unsigned int aom_highbd_avg_8x8_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}